

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall QTreeView::rowsInserted(QTreeView *this,QModelIndex *parent,int start,int end)

{
  QPersistentModelIndex *pQVar1;
  QTreeViewPrivate *this_00;
  QAbstractItemModel *pQVar2;
  Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
  *this_01;
  Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this_02;
  bool bVar3;
  char cVar4;
  int iVar5;
  int iVar6;
  Node<QPersistentModelIndex,_QHashDummyValue> *pNVar7;
  pointer pQVar8;
  QWidget *this_03;
  int iVar9;
  long in_FS_OFFSET;
  bool bVar10;
  Bucket BVar11;
  QModelIndex local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QTreeViewPrivate **)
             &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget.
              field_0x8;
  if (((this_00->super_QAbstractItemViewPrivate).delayedPendingLayout != false) ||
     (((parent->c != 0 && (-1 < (parent->c | parent->r))) &&
      ((parent->m).ptr != (QAbstractItemModel *)0x0)))) goto LAB_005b30ae;
  pQVar2 = (this_00->super_QAbstractItemViewPrivate).model;
  iVar5 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,parent);
  iVar9 = (end - start) + 1;
  pQVar1 = &(this_00->super_QAbstractItemViewPrivate).root;
  cVar4 = comparesEqual(pQVar1,parent);
  if (cVar4 == '\0') {
    pQVar2 = (parent->m).ptr;
    if ((pQVar2 == (QAbstractItemModel *)0x0) ||
       (cVar4 = (**(code **)(*(long *)pQVar2 + 0x138))(pQVar2,parent), -1 < cVar4)) {
      local_58.m.ptr = (parent->m).ptr;
      local_58.r = parent->r;
      local_58.c = parent->c;
      local_58.i = parent->i;
      this_01 = *(Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
                  **)(*(long *)((this_00->super_QAbstractItemViewPrivate).model + 8) + 0x90);
      if (this_01 ==
          (Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
           *)0x0) goto LAB_005b3005;
      BVar11 = QHashPrivate::
               Data<QHashPrivate::MultiNode<QtPrivate::QModelIndexWrapper,_QPersistentModelIndexData_*>_>
               ::findBucket<QtPrivate::QModelIndexWrapper>(this_01,(QModelIndexWrapper *)&local_58);
      if (BVar11.span[BVar11.index] == (Span)0xff) goto LAB_005b3005;
      if (*(long *)(BVar11.span + 0x80) == 0) {
        bVar3 = false;
LAB_005b30dc:
        bVar10 = true;
      }
      else {
        QPersistentModelIndex::QPersistentModelIndex((QPersistentModelIndex *)&local_58,parent);
        this_02 = (this_00->expandedIndexes).q_hash.d;
        bVar3 = true;
        if (this_02 == (Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *)0x0)
        goto LAB_005b30dc;
        pNVar7 = QHashPrivate::Data<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::
                 findNode<QPersistentModelIndex>(this_02,(QPersistentModelIndex *)&local_58);
        bVar10 = pNVar7 == (Node<QPersistentModelIndex,_QHashDummyValue> *)0x0;
        bVar3 = true;
      }
    }
    else {
LAB_005b3005:
      bVar10 = true;
      bVar3 = false;
    }
    if (bVar3) {
      QPersistentModelIndex::~QPersistentModelIndex((QPersistentModelIndex *)&local_58);
    }
    if ((bool)(bVar10 & iVar9 < iVar5)) goto LAB_005b30ae;
  }
  iVar6 = QTreeViewPrivate::viewIndex(this_00,parent);
  if (((iVar6 == -1) || (((this_00->viewItems).d.ptr[iVar6].field_0x1c & 1) == 0)) &&
     (cVar4 = comparesEqual(pQVar1,parent), cVar4 == '\0')) {
    if ((iVar6 != -1) && (iVar5 == iVar9)) {
      pQVar8 = QList<QTreeViewItem>::data(&this_00->viewItems);
      pQVar8[iVar6].field_0x1c = pQVar8[iVar6].field_0x1c | 4;
      this_03 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::update(this_03);
    }
  }
  else {
    QAbstractItemViewPrivate::doDelayedItemsLayout(&this_00->super_QAbstractItemViewPrivate,0);
  }
LAB_005b30ae:
  QAbstractItemView::rowsInserted((QAbstractItemView *)this,parent,start,end);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::rowsInserted(const QModelIndex &parent, int start, int end)
{
    Q_D(QTreeView);
    // if we are going to do a complete relayout anyway, there is no need to update
    if (d->delayedPendingLayout) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    //don't add a hierarchy on a column != 0
    if (parent.column() != 0 && parent.isValid()) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentRowCount = d->model->rowCount(parent);
    const int delta = end - start + 1;
    if (parent != d->root && !d->isIndexExpanded(parent) && parentRowCount > delta) {
        QAbstractItemView::rowsInserted(parent, start, end);
        return;
    }

    const int parentItem = d->viewIndex(parent);
    if (((parentItem != -1) && d->viewItems.at(parentItem).expanded)
        || (parent == d->root)) {
        d->doDelayedItemsLayout();
    } else if (parentItem != -1 && parentRowCount == delta) {
        // the parent just went from 0 children to more. update to re-paint the decoration
        d->viewItems[parentItem].hasChildren = true;
        viewport()->update();
    }
    QAbstractItemView::rowsInserted(parent, start, end);
}